

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O2

int SSL_set_handshake_hints(SSL *ssl,uint8_t *hints,size_t hints_len)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  int iVar2;
  pointer __p;
  UniquePtr<SSL_HANDSHAKE_HINTS> __p_00;
  int line;
  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj;
  uint64_t group_id;
  size_t local_110;
  CBS secret;
  CBS ciphertext;
  CBS seq;
  int has_ticket;
  int has_psk;
  int has_ecdhe;
  int has_server_random_tls12;
  int has_cert_compression;
  int has_signature_hint;
  int has_key_share;
  int has_server_random_tls13;
  uint64_t sig_alg;
  CBS signature_hint;
  CBS ecdhe;
  CBS cert_compression;
  CBS key_share;
  CBS ticket;
  CBS server_random_tls12;
  CBS psk;
  CBS server_random_tls13;
  CBS cbs;
  
  iVar2 = SSL_is_dtls(ssl);
  if (iVar2 != 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,0x405);
    return 0;
  }
  hints_obj._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter,_true,_true>)
       bssl::New<bssl::SSL_HANDSHAKE_HINTS>();
  if ((tuple<bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>)
      hints_obj._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl !=
      (_Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>)0x0) {
    cbs.data = hints;
    cbs.len = hints_len;
    iVar2 = CBS_get_asn1(&cbs,&seq,0x20000010);
    line = 0x427;
    if (((((iVar2 == 0) ||
          (iVar2 = CBS_get_optional_asn1
                             (&seq,&server_random_tls13,&has_server_random_tls13,0x80000000),
          iVar2 == 0)) ||
         (iVar2 = CBS_get_optional_asn1(&seq,&key_share,&has_key_share,0xa0000001), iVar2 == 0)) ||
        (((iVar2 = CBS_get_optional_asn1(&seq,&signature_hint,&has_signature_hint,0xa0000002),
          iVar2 == 0 || (iVar2 = CBS_get_optional_asn1(&seq,&psk,&has_psk,0x80000003), iVar2 == 0))
         || ((bVar1 = get_optional_implicit_null
                                (&seq,(bool *)((long)hints_obj._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                                  .
                                                  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>
                                                  ._M_head_impl + 0x90),0x80000004), !bVar1 ||
             ((iVar2 = CBS_get_optional_asn1
                                 (&seq,&cert_compression,&has_cert_compression,0x80000005),
              iVar2 == 0 ||
              (iVar2 = CBS_get_optional_asn1
                                 (&seq,&server_random_tls12,&has_server_random_tls12,0x80000006),
              iVar2 == 0)))))))) ||
       ((iVar2 = CBS_get_optional_asn1(&seq,&ecdhe,&has_ecdhe,0x20000007), iVar2 == 0 ||
        (((iVar2 = CBS_get_optional_asn1(&seq,&ticket,&has_ticket,0x80000008), iVar2 == 0 ||
          (bVar1 = get_optional_implicit_null
                             (&seq,(bool *)((long)hints_obj._M_t.
                                                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                                  .
                                                  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>
                                                  ._M_head_impl + 0xf0),0x80000009), !bVar1)) ||
         (bVar1 = get_optional_implicit_null
                            (&seq,(bool *)((long)hints_obj._M_t.
                                                 super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                                 .
                                                 super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>
                                                 ._M_head_impl + 0xf1),0x8000000a), !bVar1)))))) {
LAB_002144cf:
      iVar2 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,line);
      goto LAB_00214778;
    }
    if ((has_server_random_tls13 == 0) ||
       (bVar1 = bssl::Array<unsigned_char>::CopyFrom
                          ((Array<unsigned_char> *)
                           ((long)hints_obj._M_t.
                                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                  _M_head_impl + 0x10),
                           (Span<const_unsigned_char>)server_random_tls13), bVar1)) {
      if (has_key_share != 0) {
        iVar2 = CBS_get_asn1_uint64(&key_share,&group_id);
        if (((iVar2 == 0) ||
            (CONCAT62(group_id._2_6_,(undefined2)group_id) - 0x10000U < 0xffffffffffff0001)) ||
           ((iVar2 = CBS_get_asn1(&key_share,&ciphertext,4), iVar2 == 0 ||
            (((bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                 ((Array<unsigned_char> *)
                                  ((long)hints_obj._M_t.
                                         super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                         _M_head_impl + 0x28),(Span<const_unsigned_char>)ciphertext)
              , !bVar1 || (iVar2 = CBS_get_asn1(&key_share,&secret,4), iVar2 == 0)) ||
             (bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                ((Array<unsigned_char> *)
                                 ((long)hints_obj._M_t.
                                        super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                        _M_head_impl + 0x38),(Span<const_unsigned_char>)secret),
             !bVar1)))))) {
          iVar2 = 0;
          ERR_put_error(0x10,0,0x13c,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                        ,0x439);
          goto LAB_00214778;
        }
        *(undefined2 *)
         ((long)hints_obj._M_t.
                super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl + 0x20) =
             (undefined2)group_id;
      }
      if (has_signature_hint != 0) {
        iVar2 = CBS_get_asn1_uint64(&signature_hint,&sig_alg);
        if (((iVar2 == 0) ||
            (CONCAT62(sig_alg._2_6_,(undefined2)sig_alg) - 0x10000U < 0xffffffffffff0001)) ||
           ((((iVar2 = CBS_get_asn1(&signature_hint,&ciphertext,4), iVar2 == 0 ||
              ((bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                  ((Array<unsigned_char> *)
                                   ((long)hints_obj._M_t.
                                          super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>
                                          ._M_head_impl + 0x50),
                                   (Span<const_unsigned_char>)ciphertext), !bVar1 ||
               (iVar2 = CBS_get_asn1(&signature_hint,&secret,4), iVar2 == 0)))) ||
             (bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                ((Array<unsigned_char> *)
                                 ((long)hints_obj._M_t.
                                        super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                        _M_head_impl + 0x60),(Span<const_unsigned_char>)secret),
             !bVar1)) ||
            ((iVar2 = CBS_get_asn1(&signature_hint,(CBS *)&group_id,4), iVar2 == 0 ||
             (in.data_._2_6_ = group_id._2_6_, in.data_._0_2_ = (undefined2)group_id,
             in.size_ = local_110,
             bVar1 = bssl::Array<unsigned_char>::CopyFrom
                               ((Array<unsigned_char> *)
                                ((long)hints_obj._M_t.
                                       super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                       _M_head_impl + 0x70),in), !bVar1)))))) {
          iVar2 = 0;
          ERR_put_error(0x10,0,0x13c,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                        ,0x44a);
          goto LAB_00214778;
        }
        *(undefined2 *)
         ((long)hints_obj._M_t.
                super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl + 0x48) =
             (undefined2)sig_alg;
      }
      if (has_psk != 0) {
        bVar1 = bssl::Array<unsigned_char>::CopyFrom
                          ((Array<unsigned_char> *)
                           ((long)hints_obj._M_t.
                                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                  _M_head_impl + 0x80),(Span<const_unsigned_char>)psk);
        if (!bVar1) goto LAB_00214776;
        if ((has_psk != 0) &&
           (line = 0x454,
           *(char *)((long)hints_obj._M_t.
                           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl +
                    0x90) != '\0')) goto LAB_002144cf;
      }
      if (has_cert_compression != 0) {
        iVar2 = CBS_get_asn1_uint64(&cert_compression,&group_id);
        if (((((iVar2 == 0) ||
              (CONCAT62(group_id._2_6_,(undefined2)group_id) - 0x10000U < 0xffffffffffff0001)) ||
             (iVar2 = CBS_get_asn1(&cert_compression,&ciphertext,4), iVar2 == 0)) ||
            ((bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                ((Array<unsigned_char> *)
                                 ((long)hints_obj._M_t.
                                        super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                        _M_head_impl + 0x98),(Span<const_unsigned_char>)ciphertext),
             !bVar1 || (iVar2 = CBS_get_asn1(&cert_compression,&secret,4), iVar2 == 0)))) ||
           (bVar1 = bssl::Array<unsigned_char>::CopyFrom
                              ((Array<unsigned_char> *)
                               ((long)hints_obj._M_t.
                                      super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                      _M_head_impl + 0xa8),(Span<const_unsigned_char>)secret),
           !bVar1)) {
          iVar2 = 0;
          ERR_put_error(0x10,0,0x13c,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                        ,0x461);
          goto LAB_00214778;
        }
        *(undefined2 *)
         ((long)hints_obj._M_t.
                super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl + 0x92) =
             (undefined2)group_id;
      }
      if ((has_server_random_tls12 == 0) ||
         (bVar1 = bssl::Array<unsigned_char>::CopyFrom
                            ((Array<unsigned_char> *)
                             hints_obj._M_t.
                             super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                             .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl
                             ,(Span<const_unsigned_char>)server_random_tls12), bVar1)) {
        if (has_ecdhe != 0) {
          iVar2 = CBS_get_asn1_uint64(&ecdhe,&group_id);
          if ((((iVar2 == 0) ||
               (CONCAT62(group_id._2_6_,(undefined2)group_id) - 0x10000U < 0xffffffffffff0001)) ||
              (iVar2 = CBS_get_asn1(&ecdhe,&ciphertext,4), iVar2 == 0)) ||
             (((bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                  ((Array<unsigned_char> *)
                                   ((long)hints_obj._M_t.
                                          super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>
                                          ._M_head_impl + 0xc0),
                                   (Span<const_unsigned_char>)ciphertext), !bVar1 ||
               (iVar2 = CBS_get_asn1(&ecdhe,&secret,4), iVar2 == 0)) ||
              (bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                 ((Array<unsigned_char> *)
                                  ((long)hints_obj._M_t.
                                         super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                         _M_head_impl + 0xd0),(Span<const_unsigned_char>)secret),
              !bVar1)))) {
            iVar2 = 0;
            ERR_put_error(0x10,0,0x13c,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                          ,0x475);
            goto LAB_00214778;
          }
          *(undefined2 *)
           ((long)hints_obj._M_t.
                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl + 0xb8) =
               (undefined2)group_id;
        }
        if (has_ticket == 0) {
LAB_00214792:
          line = 0x483;
          __p_00._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t
          .super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl =
               hints_obj._M_t.
               super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
          if (*(char *)((long)hints_obj._M_t.
                              super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                              _M_head_impl + 0xf0) == '\x01') goto LAB_002144cf;
        }
        else {
          bVar1 = bssl::Array<unsigned_char>::CopyFrom
                            ((Array<unsigned_char> *)
                             ((long)hints_obj._M_t.
                                    super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                    _M_head_impl + 0xe0),(Span<const_unsigned_char>)ticket);
          if (!bVar1) goto LAB_00214776;
          if (has_ticket == 0) goto LAB_00214792;
          line = 0x47f;
          __p_00 = hints_obj;
          if (*(char *)((long)hints_obj._M_t.
                              super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                              _M_head_impl + 0xf1) != '\0') goto LAB_002144cf;
        }
        hints_obj._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>.
        _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>)0x0;
        std::__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)
                   &((ssl->s3->hs)._M_t.
                     super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->hints,
                   (pointer)__p_00._M_t.
                            super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                            .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl)
        ;
        iVar2 = 1;
        goto LAB_00214778;
      }
    }
  }
LAB_00214776:
  iVar2 = 0;
LAB_00214778:
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr(&hints_obj);
  return iVar2;
}

Assistant:

int SSL_set_handshake_hints(SSL *ssl, const uint8_t *hints, size_t hints_len) {
  if (SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj = MakeUnique<SSL_HANDSHAKE_HINTS>();
  if (hints_obj == nullptr) {
    return 0;
  }

  CBS cbs, seq, server_random_tls13, key_share, signature_hint, psk,
      cert_compression, server_random_tls12, ecdhe, ticket;
  int has_server_random_tls13, has_key_share, has_signature_hint, has_psk,
      has_cert_compression, has_server_random_tls12, has_ecdhe, has_ticket;
  CBS_init(&cbs, hints, hints_len);
  if (!CBS_get_asn1(&cbs, &seq, CBS_ASN1_SEQUENCE) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls13,
                             &has_server_random_tls13, kServerRandomTLS13Tag) ||
      !CBS_get_optional_asn1(&seq, &key_share, &has_key_share,
                             kKeyShareHintTag) ||
      !CBS_get_optional_asn1(&seq, &signature_hint, &has_signature_hint,
                             kSignatureHintTag) ||
      !CBS_get_optional_asn1(&seq, &psk, &has_psk, kDecryptedPSKTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_psk,
                                  kIgnorePSKTag) ||
      !CBS_get_optional_asn1(&seq, &cert_compression, &has_cert_compression,
                             kCompressCertificateTag) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls12,
                             &has_server_random_tls12, kServerRandomTLS12Tag) ||
      !CBS_get_optional_asn1(&seq, &ecdhe, &has_ecdhe, kECDHEHintTag) ||
      !CBS_get_optional_asn1(&seq, &ticket, &has_ticket, kDecryptedTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->renew_ticket,
                                  kRenewTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_ticket,
                                  kIgnoreTicketTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_server_random_tls13 &&
      !hints_obj->server_random_tls13.CopyFrom(server_random_tls13)) {
    return 0;
  }

  if (has_key_share) {
    uint64_t group_id;
    CBS ciphertext, secret;
    if (!CBS_get_asn1_uint64(&key_share, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&key_share, &ciphertext, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_ciphertext.CopyFrom(ciphertext) ||
        !CBS_get_asn1(&key_share, &secret, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_secret.CopyFrom(secret)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->key_share_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_signature_hint) {
    uint64_t sig_alg;
    CBS input, spki, signature;
    if (!CBS_get_asn1_uint64(&signature_hint, &sig_alg) ||  //
        sig_alg == 0 || sig_alg > 0xffff ||
        !CBS_get_asn1(&signature_hint, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_input.CopyFrom(input) ||
        !CBS_get_asn1(&signature_hint, &spki, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_spki.CopyFrom(spki) ||
        !CBS_get_asn1(&signature_hint, &signature, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature.CopyFrom(signature)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->signature_algorithm = static_cast<uint16_t>(sig_alg);
  }

  if (has_psk && !hints_obj->decrypted_psk.CopyFrom(psk)) {
    return 0;
  }
  if (has_psk && hints_obj->ignore_psk) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_cert_compression) {
    uint64_t alg;
    CBS input, output;
    if (!CBS_get_asn1_uint64(&cert_compression, &alg) ||  //
        alg == 0 || alg > 0xffff ||
        !CBS_get_asn1(&cert_compression, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_input.CopyFrom(input) ||
        !CBS_get_asn1(&cert_compression, &output, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_output.CopyFrom(output)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->cert_compression_alg_id = static_cast<uint16_t>(alg);
  }

  if (has_server_random_tls12 &&
      !hints_obj->server_random_tls12.CopyFrom(server_random_tls12)) {
    return 0;
  }

  if (has_ecdhe) {
    uint64_t group_id;
    CBS public_key, private_key;
    if (!CBS_get_asn1_uint64(&ecdhe, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&ecdhe, &public_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_public_key.CopyFrom(public_key) ||
        !CBS_get_asn1(&ecdhe, &private_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_private_key.CopyFrom(private_key)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->ecdhe_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_ticket && !hints_obj->decrypted_ticket.CopyFrom(ticket)) {
    return 0;
  }
  if (has_ticket && hints_obj->ignore_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }
  if (!has_ticket && hints_obj->renew_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  ssl->s3->hs->hints = std::move(hints_obj);
  return 1;
}